

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O1

SourceResultType __thiscall
duckdb::PhysicalHashAggregate::GetData
          (PhysicalHashAggregate *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  LocalSourceState *this_00;
  GlobalSourceState *pGVar1;
  DataChunk *pDVar2;
  SourceResultType SVar3;
  idx_t iVar4;
  const_reference this_01;
  reference this_02;
  reference this_03;
  reference this_04;
  type sink_p;
  int iVar5;
  unique_lock<std::mutex> guard;
  OperatorSourceInput source_input;
  undefined4 local_a4;
  LocalSourceState local_a0;
  DataChunk *local_98;
  unique_lock<std::mutex> local_90;
  mutex *local_80;
  mutex *local_78;
  vector<duckdb::HashAggregateGroupingData,_true> *local_70;
  vector<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>,_true>
  *local_68;
  pointer local_60;
  ExecutionContext *local_58;
  OperatorSourceInput *local_50;
  OperatorSourceInput local_48;
  
  local_98 = chunk;
  local_58 = context;
  local_60 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator->(&(this->super_PhysicalOperator).sink_state);
  pGVar1 = input->global_state;
  this_00 = input->local_state + 1;
  local_70 = &this->groupings;
  local_60 = local_60 + 1;
  local_78 = &pGVar1[1].super_StateWithBlockableTasks.lock;
  local_68 = (vector<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>,_true>
              *)(input->local_state + 2);
  local_80 = &(pGVar1->super_StateWithBlockableTasks).lock;
  local_a4 = SUB84(local_80,0);
  local_50 = input;
  do {
    if (this_00->_vptr_LocalSourceState == (_func_int **)0xffffffffffffffff) {
      optional_idx::optional_idx
                ((optional_idx *)&local_48,*(idx_t *)&pGVar1[1].super_StateWithBlockableTasks);
      this_00->_vptr_LocalSourceState = (_func_int **)local_48.global_state;
    }
    iVar4 = optional_idx::GetIndex((optional_idx *)this_00);
    iVar5 = 3;
    if (iVar4 < (ulong)(((long)(this->groupings).
                               super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                               .
                               super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->groupings).
                               super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                               .
                               super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7)
       ) {
      this_01 = vector<duckdb::HashAggregateGroupingData,_true>::operator[](local_70,iVar4);
      this_02 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::operator[]
                          ((vector<duckdb::HashAggregateGroupingGlobalState,_true> *)local_60,iVar4)
      ;
      this_03 = vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
                              *)local_78,iVar4);
      local_48.global_state =
           unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
           ::operator*(this_03);
      this_04 = vector<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>,_true>
                ::operator[](local_68,iVar4);
      local_48.local_state =
           unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
           ::operator*(this_04);
      local_48.interrupt_state = local_50->interrupt_state;
      sink_p = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
               ::operator*(&this_02->table_state);
      pDVar2 = local_98;
      SVar3 = RadixPartitionedHashTable::GetData
                        (&this_01->table_data,local_58,local_98,sink_p,&local_48);
      iVar5 = 1;
      if (SVar3 == BLOCKED) {
        local_a4 = 2;
      }
      else if (pDVar2->count == 0) {
        local_90._M_device = local_80;
        local_90._M_owns = false;
        ::std::unique_lock<std::mutex>::lock(&local_90);
        local_90._M_owns = true;
        iVar4 = optional_idx::GetIndex((optional_idx *)this_00);
        optional_idx::optional_idx((optional_idx *)&local_a0,iVar4 + 1);
        this_00->_vptr_LocalSourceState = local_a0._vptr_LocalSourceState;
        iVar4 = optional_idx::GetIndex((optional_idx *)this_00);
        if (*(ulong *)&pGVar1[1].super_StateWithBlockableTasks < iVar4) {
          iVar4 = optional_idx::GetIndex((optional_idx *)this_00);
          LOCK();
          *(idx_t *)&pGVar1[1].super_StateWithBlockableTasks = iVar4;
          UNLOCK();
        }
        optional_idx::optional_idx
                  ((optional_idx *)&local_a0,*(idx_t *)&pGVar1[1].super_StateWithBlockableTasks);
        this_00->_vptr_LocalSourceState = local_a0._vptr_LocalSourceState;
        ::std::unique_lock<std::mutex>::~unique_lock(&local_90);
        iVar5 = 0;
      }
      else {
        local_a4 = 0;
      }
    }
  } while (iVar5 == 0);
  if (iVar5 == 3) {
    SVar3 = local_98->count == 0;
  }
  else {
    SVar3 = (SourceResultType)local_a4;
  }
  return SVar3;
}

Assistant:

SourceResultType PhysicalHashAggregate::GetData(ExecutionContext &context, DataChunk &chunk,
                                                OperatorSourceInput &input) const {
	auto &sink_gstate = sink_state->Cast<HashAggregateGlobalSinkState>();
	auto &gstate = input.global_state.Cast<HashAggregateGlobalSourceState>();
	auto &lstate = input.local_state.Cast<HashAggregateLocalSourceState>();
	while (true) {
		if (!lstate.radix_idx.IsValid()) {
			lstate.radix_idx = gstate.state_index.load();
		}
		const auto radix_idx = lstate.radix_idx.GetIndex();
		if (radix_idx >= groupings.size()) {
			break;
		}

		auto &grouping = groupings[radix_idx];
		auto &radix_table = grouping.table_data;
		auto &grouping_gstate = sink_gstate.grouping_states[radix_idx];

		OperatorSourceInput source_input {*gstate.radix_states[radix_idx], *lstate.radix_states[radix_idx],
		                                  input.interrupt_state};
		auto res = radix_table.GetData(context, chunk, *grouping_gstate.table_state, source_input);
		if (res == SourceResultType::BLOCKED) {
			return res;
		}
		if (chunk.size() != 0) {
			return SourceResultType::HAVE_MORE_OUTPUT;
		}

		// move to the next table
		auto guard = gstate.Lock();
		lstate.radix_idx = lstate.radix_idx.GetIndex() + 1;
		if (lstate.radix_idx.GetIndex() > gstate.state_index) {
			// we have not yet worked on the table
			// move the global index forwards
			gstate.state_index = lstate.radix_idx.GetIndex();
		}
		lstate.radix_idx = gstate.state_index.load();
	}

	return chunk.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}